

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O2

double HighsIntegers::integralScale(double *vals,HighsInt numVals,double deltadown,double deltaup)

{
  double *pdVar1;
  int64_t iVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double __x;
  pair<const_double_*,_const_double_*> pVar15;
  HighsCDouble HVar16;
  HighsCDouble local_c0;
  double local_b0;
  double *local_a8;
  HighsCDouble local_a0;
  ulong local_90;
  double local_88;
  HighsCDouble local_80;
  int local_6c;
  double local_68;
  int local_4c;
  double local_48;
  double dStack_40;
  
  if (numVals != 0) {
    local_b0 = deltaup;
    local_a8 = vals;
    local_68 = deltadown;
    pVar15 = std::
             __minmax_element<double_const*,__gnu_cxx::__ops::_Iter_comp_iter<HighsIntegers::integralScale(double_const*,int,double,double)::_lambda(double,double)_1_>>
                       (vals,vals + numVals);
    dVar11 = *pVar15.first;
    local_6c = 0;
    if ((dVar11 < -local_68) || (__x = *pVar15.second, local_b0 < dVar11)) {
      local_88 = *pVar15.second;
      frexp(dVar11,&local_6c);
      __x = local_88;
    }
    iVar8 = 0;
    if (local_6c < 0) {
      iVar8 = -local_6c;
    }
    frexp(__x,&local_4c);
    iVar5 = 0x20;
    if (local_4c < 0x20) {
      iVar5 = local_4c;
    }
    bVar4 = 0x20 - (char)iVar5;
    if (iVar5 + iVar8 + 3 < 0x21) {
      bVar4 = (char)iVar8 + 3;
    }
    uVar6 = 0x4bL << (bVar4 & 0x3f);
    local_a0.hi = *local_a8;
    local_a0.lo = 0.0;
    local_80 = HighsCDouble::operator*(&local_a0,(double)(long)uVar6);
    local_c0 = HighsCDouble::operator+(&local_80,local_b0);
    dVar11 = local_c0.lo;
    local_a0.hi = floor(local_c0.hi);
    local_a0.lo = dVar11;
    HVar16 = HighsCDouble::operator-(&local_80,&local_a0);
    dVar11 = HVar16.lo + HVar16.hi;
    uVar9 = uVar6;
    if (local_68 < dVar11) {
      iVar2 = denominator(dVar11,local_b0,1000);
      uVar9 = iVar2 * uVar6;
      auVar12._8_4_ = (int)(uVar9 >> 0x20);
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = 0x45300000;
      local_c0.lo = 0.0;
      local_c0.hi = *local_a8;
      local_80 = HighsCDouble::operator*
                           (&local_c0,
                            (auVar12._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      local_c0 = HighsCDouble::operator+(&local_80,local_b0);
      dVar11 = local_c0.lo;
      local_a0.hi = floor(local_c0.hi);
      local_a0.lo = dVar11;
      HVar16 = HighsCDouble::operator-(&local_80,&local_a0);
      if (local_68 < HVar16.lo + HVar16.hi) {
        return 0.0;
      }
    }
    pdVar1 = local_a8;
    uVar3 = (ulong)ABS(local_a0.hi + local_a0.lo);
    uVar3 = (long)(ABS(local_a0.hi + local_a0.lo) - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
            uVar3;
    uVar7 = 1;
    local_90 = uVar6;
    local_88 = (double)(ulong)(uint)numVals;
    while( true ) {
      auVar13._8_4_ = (int)(uVar9 >> 0x20);
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = 0x45300000;
      dVar11 = (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
      if (local_88 == (double)uVar7) break;
      local_c0.lo = 0.0;
      local_c0.hi = local_a8[uVar7];
      local_80 = HighsCDouble::operator*(&local_c0,dVar11);
      local_c0 = HighsCDouble::operator+(&local_80,local_b0);
      dVar11 = local_c0.lo;
      local_a0.hi = floor(local_c0.hi);
      local_a0.lo = dVar11;
      HVar16 = HighsCDouble::operator-(&local_80,&local_a0);
      if (local_68 < HVar16.lo + HVar16.hi) {
        local_c0.lo = 0.0;
        local_c0.hi = pdVar1[uVar7];
        local_80 = HighsCDouble::operator*(&local_c0,(double)(long)local_90);
        dVar11 = local_80.lo;
        local_c0.hi = floor(local_80.hi);
        local_c0.lo = dVar11;
        HVar16 = HighsCDouble::operator-(&local_80,&local_c0);
        iVar2 = denominator(HVar16.hi + HVar16.lo,local_b0,1000);
        uVar9 = uVar9 * iVar2;
        auVar14._8_4_ = (int)(uVar9 >> 0x20);
        auVar14._0_8_ = uVar9;
        auVar14._12_4_ = 0x45300000;
        dStack_40 = auVar14._8_8_ - 1.9342813113834067e+25;
        local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
        local_c0.lo = 0.0;
        local_c0.hi = pdVar1[uVar7];
        local_80 = HighsCDouble::operator*(&local_c0,local_48);
        local_c0 = HighsCDouble::operator+(&local_80,local_b0);
        dVar11 = local_c0.lo;
        local_a0.hi = floor(local_c0.hi);
        local_a0.lo = dVar11;
        HVar16 = HighsCDouble::operator-(&local_80,&local_a0);
        dVar11 = local_48;
        if (local_68 < HVar16.lo + HVar16.hi) break;
      }
      if (uVar3 == 1) {
        uVar3 = 1;
      }
      else {
        uVar3 = gcd(uVar3,(long)(local_a0.hi + local_a0.lo));
        uVar6 = local_90;
        if (uVar9 >> 0x20 != 0) {
          uVar9 = uVar9 / uVar3;
          if (local_90 == 1) {
            local_90 = 1;
          }
          else {
            iVar2 = gcd(uVar3,local_90);
            local_90 = (long)uVar6 / iVar2;
          }
          uVar3 = 1;
        }
      }
      uVar7 = uVar7 + 1;
    }
    local_48 = dVar11;
    if (local_88 == (double)uVar7) {
      auVar10._8_4_ = (int)(uVar3 >> 0x20);
      auVar10._0_8_ = uVar3;
      auVar10._12_4_ = 0x45300000;
      return local_48 /
             ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    }
  }
  return 0.0;
}

Assistant:

static double integralScale(const double* vals, HighsInt numVals,
                              double deltadown, double deltaup) {
    if (numVals == 0) return 0.0;

    auto minmax = std::minmax_element(
        vals, vals + numVals,
        [](double a, double b) { return std::abs(a) < std::abs(b); });
    const double minval = *minmax.first;
    const double maxval = *minmax.second;

    int expshift = 0;

    // to cover many small denominators at once use a denominator of 75 * 2^n
    // with n-3 being large enough so that the smallest value is not below 0.5
    // but ignore tiny values bew deltadown/deltaup.
    if (minval < -deltadown || minval > deltaup) std::frexp(minval, &expshift);
    expshift = std::max(-expshift, 0) + 3;

    // guard against making the largest value too big which may cause overflows
    // with intermediate gcd values
    int expMaxVal;
    std::frexp(maxval, &expMaxVal);
    expMaxVal = std::min(expMaxVal, 32);
    if (expMaxVal + expshift > 32) expshift = 32 - expMaxVal;

    uint64_t denom = uint64_t{75} << expshift;
    int64_t startdenom = denom;
    // now check if the values are integral and if not compute a common
    // denominator for their remaining fraction
    HighsCDouble val = startdenom * HighsCDouble(vals[0]);
    HighsCDouble downval = floor(val + deltaup);
    HighsCDouble fraction = val - downval;

    if (fraction > deltadown) {
      // use a continued fraction algorithm to compute small missing
      // denominators for the remaining fraction
      denom *= denominator(double(fraction), deltaup, 1000);
      val = denom * HighsCDouble(vals[0]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      // if this is not sufficient for reaching integrality, we stop here
      if (fraction > deltadown) return 0.0;
    }

    uint64_t currgcd = (uint64_t)std::abs(double(downval));

    for (HighsInt i = 1; i != numVals; ++i) {
      val = denom * HighsCDouble(vals[i]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      if (fraction > deltadown) {
        val = startdenom * HighsCDouble(vals[i]);
        fraction = val - floor(val);
        denom *= denominator(double(fraction), deltaup, 1000);
        val = denom * HighsCDouble(vals[i]);
        downval = floor(val + deltaup);
        fraction = val - downval;

        if (fraction > deltadown) return 0.0;
      }

      if (currgcd != 1) {
        currgcd = gcd(currgcd, (int64_t) double(downval));

        // if the denominator is large, divide by the current gcd to prevent
        // unnecessary overflows
        if (denom > std::numeric_limits<unsigned int>::max()) {
          denom /= currgcd;
          if (startdenom != 1) startdenom /= gcd(currgcd, startdenom);
          currgcd = 1;
        }
      }
    }

    return static_cast<double>(denom) / static_cast<double>(currgcd);
  }